

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O1

void spirv_cross::inner::
     join_helper<std::__cxx11::string&,char,unsigned_int&,char,std::__cxx11::string&>
               (StringStream<4096UL,_4096UL> *stream,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t,char *ts,
               uint *ts_1,char *ts_2,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_3)

{
  char local_29;
  
  StringStream<4096UL,_4096UL>::append(stream,(t->_M_dataplus)._M_p,t->_M_string_length);
  local_29 = *ts;
  StringStream<4096UL,_4096UL>::append(stream,&local_29,1);
  join_helper<unsigned_int&,char,std::__cxx11::string&>(stream,ts_1,ts_2,ts_3);
  return;
}

Assistant:

void join_helper(StringStream<> &stream, T &&t, Ts &&... ts)
{
	stream << std::forward<T>(t);
	join_helper(stream, std::forward<Ts>(ts)...);
}